

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_synthesis.cpp
# Opt level: O2

QueryPlan * compileQuery_NonComputeAll(void)

{
  _func_int *p_Var1;
  ColValCondDAGNode *this;
  _func_int **pp_Var2;
  BaseOperator *pBVar3;
  QueryPlan *pQVar4;
  long lVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator<char> local_fb;
  allocator_type local_fa;
  allocator<char> local_f9;
  ColValCondDAGNode *local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  col_names;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8 [32];
  string local_98 [32];
  string local_78;
  _Vector_base<CondDAGNode_*,_std::allocator<CondDAGNode_*>_> local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"extprice",(allocator<char> *)&local_f8);
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"discount",&local_fb);
  std::__cxx11::string::string<std::allocator<char>>(local_98,"tax",&local_f9);
  __l._M_len = 3;
  __l._M_array = &local_d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&col_names,__l,&local_fa);
  lVar5 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&local_d8._M_dataplus._M_p + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  p_Var1 = (_func_int *)operator_new(0x30);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_38,&col_names);
  *(undefined ***)p_Var1 = &PTR__ScanOperator_00107c10;
  *(undefined4 *)(p_Var1 + 8) = 100000;
  *(pointer *)(p_Var1 + 0x10) =
       local_38.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)(p_Var1 + 0x18) =
       local_38.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)(p_Var1 + 0x20) =
       local_38.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var1[0x28] = (code)0x1;
  *(undefined4 *)(p_Var1 + 0x2c) = 100;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  local_d8._M_dataplus._M_p = (pointer)0x0;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_allocated_capacity = 0;
  this = (ColValCondDAGNode *)operator_new(0x48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"tax",&local_fb);
  ColValCondDAGNode::ColValCondDAGNode(this,1,&local_78,0x5a);
  local_f8 = this;
  std::vector<CondDAGNode*,std::allocator<CondDAGNode*>>::emplace_back<CondDAGNode*>
            ((vector<CondDAGNode*,std::allocator<CondDAGNode*>> *)&local_d8,
             (CondDAGNode **)&local_f8);
  std::__cxx11::string::~string((string *)&local_78);
  pp_Var2 = (_func_int **)operator_new(0x28);
  std::vector<CondDAGNode_*,_std::allocator<CondDAGNode_*>_>::vector
            ((vector<CondDAGNode_*,_std::allocator<CondDAGNode_*>_> *)&local_58,
             (vector<CondDAGNode_*,_std::allocator<CondDAGNode_*>_> *)&local_d8);
  *pp_Var2 = (_func_int *)&PTR__SelectVectorizationOnlyNonBranchingOperator_00107cd8;
  pp_Var2[1] = p_Var1;
  pp_Var2[2] = (_func_int *)local_58._M_impl.super__Vector_impl_data._M_start;
  pp_Var2[3] = (_func_int *)local_58._M_impl.super__Vector_impl_data._M_finish;
  pp_Var2[4] = (_func_int *)local_58._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<CondDAGNode_*,_std::allocator<CondDAGNode_*>_>::~_Vector_base(&local_58);
  pBVar3 = (BaseOperator *)operator_new(0x10);
  pBVar3->_vptr_BaseOperator = (_func_int **)&PTR__ProjectJitNonComputeAllOperator_00107d78;
  pBVar3[1]._vptr_BaseOperator = pp_Var2;
  pQVar4 = (QueryPlan *)operator_new(0x10);
  pQVar4->head_ = pBVar3;
  pQVar4->print_result_ = false;
  std::_Vector_base<CondDAGNode_*,_std::allocator<CondDAGNode_*>_>::~_Vector_base
            ((_Vector_base<CondDAGNode_*,_std::allocator<CondDAGNode_*>_> *)&local_d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&col_names);
  return pQVar4;
}

Assistant:

QueryPlan *compileQuery_NonComputeAll() {
    std::vector<std::string> col_names{"extprice", "discount", "tax"};
    ScanOperator *scan_op = new ScanOperator(BATCHES, col_names, true, 100);
    std::vector<CondDAGNode*> expr{};
    expr.push_back(new ColValCondDAGNode(COND_LT, "tax", 90));

    auto sel_op = new SelectVectorizationOnlyNonBranchingOperator(scan_op, expr);
    auto proj_op = new ProjectJitNonComputeAllOperator(sel_op);
    return new QueryPlan(proj_op, false);
}